

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrUuid *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  string data_prefix;
  string data_array_prefix;
  ostringstream oss_data;
  ostringstream oss_data_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_368 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
               *)contents;
  local_320[0]._M_dataplus._M_p = (pointer)value;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct((ulong)local_1a8,'\x12');
  *local_1a8[0]._M_dataplus._M_p = '0';
  local_1a8[0]._M_dataplus._M_p[1] = 'x';
  pcVar4 = local_1a8[0]._M_dataplus._M_p + (local_1a8[0]._M_string_length - 1);
  lVar6 = 0;
  do {
    bVar2 = *(byte *)((long)&local_320[0]._M_dataplus._M_p + lVar6);
    *pcVar4 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar4[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar6 = lVar6 + 1;
    pcVar4 = pcVar4 + -2;
  } while (lVar6 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            (local_368,type_string,prefix,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_388);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0x",2);
  *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  if (value == (XrUuid *)0x0) {
    std::ios::clear((int)&local_388 + (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) +
                    0x1e0);
  }
  else {
    sVar5 = strlen((char *)value);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)value,sVar5);
  }
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            (local_368,(char (*) [9])0x2a6e29,&local_388,local_320);
  paVar1 = &local_320[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  uVar7 = 0;
  do {
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,local_388._M_dataplus._M_p,
               local_388._M_dataplus._M_p + local_388._M_string_length);
    std::__cxx11::string::append((char *)&local_360);
    local_320[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)local_320,'\x02' - (uVar7 < 10));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_320[0]._M_dataplus._M_p,(uint)local_320[0]._M_string_length,(uint)uVar7);
    std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_320[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_360);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
    *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_320[0].field_2 +
                  *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    local_340._M_dataplus._M_p._0_1_ = value->data[uVar7];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_340,1);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
              (local_368,(char (*) [8])"uint8_t",&local_360,&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_340._M_dataplus._M_p._1_7_,(uint8_t)local_340._M_dataplus._M_p) !=
        &local_340.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_340._M_dataplus._M_p._1_7_,(uint8_t)local_340._M_dataplus._M_p)
                      ,local_340.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x10);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrUuid* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string data_prefix = prefix;
        data_prefix += "data";
        std::ostringstream oss_data_array;
        oss_data_array << "0x" << std::hex << (value->data);
        contents.emplace_back("uint8_t*", data_prefix, oss_data_array.str());
        for (uint32_t value_data_inc = 0; value_data_inc < XR_UUID_SIZE; ++value_data_inc) {
            std::string data_array_prefix = data_prefix;
            data_array_prefix += "[";
            data_array_prefix += std::to_string(value_data_inc);
            data_array_prefix += "]";
            std::ostringstream oss_data;
            oss_data << "0x" << std::hex << (value->data[value_data_inc]);
            contents.emplace_back("uint8_t", data_array_prefix, oss_data.str());
        }
        return true;
    } catch(...) {
    }
    return false;
}